

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_IgnoreBOM_Test::
~ParseMessageTest_IgnoreBOM_Test(ParseMessageTest_IgnoreBOM_Test *this)

{
  ParseMessageTest_IgnoreBOM_Test *this_local;
  
  ParserTest::~ParserTest(&this->super_ParseMessageTest);
  return;
}

Assistant:

TEST_F(ParseMessageTest, IgnoreBOM) {
  char input[] =
      "   message TestMessage {\n"
      "  required int32 foo = 1;\n"
      "}\n";
  // Set UTF-8 BOM.
  input[0] = (char)0xEF;
  input[1] = (char)0xBB;
  input[2] = (char)0xBF;
  ExpectParsesTo(
      input,
      "message_type {"
      "  name: \"TestMessage\""
      "  field { name:\"foo\" label:LABEL_REQUIRED type:TYPE_INT32 number:1 }"
      "}");
}